

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O3

void __thiscall gui::TextBox::handleMouseRelease(TextBox *this,Button button,Vector2f *mouseParent)

{
  Vector2f VVar1;
  Transform *this_00;
  Vector2f *pVVar2;
  float local_38;
  float fStack_34;
  Vector2<float> local_28;
  
  this_00 = Widget::getInverseTransform(&this->super_Widget);
  VVar1 = sf::Transform::transformPoint(this_00,mouseParent);
  pVVar2 = Widget::getOrigin(&this->super_Widget);
  local_38 = VVar1.x;
  fStack_34 = VVar1.y;
  local_28.y = fStack_34 - (*pVVar2).y;
  local_28.x = local_38 - (*pVVar2).x;
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (&this->onMouseRelease,&this->super_Widget,button,&local_28);
  Widget::handleMouseRelease(&this->super_Widget,button,mouseParent);
  return;
}

Assistant:

void TextBox::handleMouseRelease(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    onMouseRelease.emit(this, button, toLocalOriginSpace(mouseParent));
    baseClass::handleMouseRelease(button, mouseParent);
}